

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O0

void gen_swstep_exception(DisasContext_conflict1 *s,int isv,int ex)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t syndrome;
  _Bool same_el;
  TCGContext_conflict1 *tcg_ctx;
  int ex_local;
  int isv_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->current_el <= s->debug_target_el) {
    syndrome = syn_swstep((uint)(s->debug_target_el == s->current_el),isv,ex);
    gen_exception(tcg_ctx_00,1,syndrome,s->debug_target_el);
    return;
  }
  __assert_fail("s->debug_target_el >= s->current_el",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.h"
                ,0x108,"void gen_swstep_exception(DisasContext *, int, int)");
}

Assistant:

static inline void gen_swstep_exception(DisasContext *s, int isv, int ex)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    bool same_el = (s->debug_target_el == s->current_el);

    /*
     * If singlestep is targeting a lower EL than the current one,
     * then s->ss_active must be false and we can never get here.
     */
    assert(s->debug_target_el >= s->current_el);

    gen_exception(tcg_ctx, EXCP_UDEF, syn_swstep(same_el, isv, ex), s->debug_target_el);
}